

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool AmpIO::WriteEncoderPreloadAll(BasePort *port,int32_t sdata)

{
  int iVar1;
  ostream *this;
  void *this_00;
  ulong uStack_28;
  uint channel;
  size_t index;
  bool ret;
  int32_t sdata_local;
  BasePort *port_local;
  
  index._3_1_ = true;
  uStack_28 = 0;
  while( true ) {
    if (7 < uStack_28) {
      return index._3_1_;
    }
    if ((0x7fffff < sdata) || (sdata < -0x800000)) break;
    if ((port != (BasePort *)0x0) && (uStack_28 < 0x10)) {
      iVar1 = (*port->_vptr_BasePort[0x24])
                        (port,0x3f,(ulong)(((int)uStack_28 + 1) * 0x10 | 4),
                         (ulong)(sdata + 0x800000));
      index._3_1_ = (index._3_1_ & (byte)iVar1 & 1) != 0;
    }
    uStack_28 = uStack_28 + 1;
  }
  this = std::operator<<((ostream *)&std::cerr,
                         "AmpIO::WriteEncoderPreloadAll, preload out of range ");
  this_00 = (void *)std::ostream::operator<<(this,sdata);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool AmpIO::WriteEncoderPreloadAll(BasePort *port, int32_t sdata)
{
    bool ret = true;
    for (size_t index = 0; index < 8; ++index) {
        unsigned int channel = (index+1) << 4;

        if ((sdata >= ENC_MIDRANGE) || (sdata < -ENC_MIDRANGE)) {
            std::cerr << "AmpIO::WriteEncoderPreloadAll, preload out of range " << sdata << std::endl;
            return false;
        }
        // Cannot use NumEncoders below because this is a static method
        if (port && (index < MAX_CHANNELS)) {
            ret &= port->WriteQuadlet(FW_NODE_BROADCAST, channel | ENC_LOAD_REG,
                                      static_cast<uint32_t>(sdata + ENC_MIDRANGE));
        }
    }
    return ret;
}